

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O2

char * ODDLParser::OpenDDLParser::parsePrimitiveDataType
                 (char *in,char *end,ValueType *type,size_t *len)

{
  char cVar1;
  int iVar2;
  size_t __n;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  char *__nptr;
  undefined **ppuVar6;
  
  *type = ddl_none;
  *len = 0;
  pcVar3 = in;
  if (in != end && in != (char *)0x0) {
    ppuVar6 = &Grammar::PrimitiveTypeToken;
    __n = 0;
    for (lVar5 = 0; lVar5 != 0xe; lVar5 = lVar5 + 1) {
      pcVar3 = *ppuVar6;
      __n = strlen(pcVar3);
      iVar2 = strncmp(in,pcVar3,__n);
      if (iVar2 == 0) {
        *type = (ValueType)lVar5;
        goto LAB_005967ad;
      }
      ppuVar6 = ppuVar6 + 1;
    }
    if (*type == ddl_none) {
      pcVar3 = lookForNextToken<char>(in,end);
      return pcVar3;
    }
LAB_005967ad:
    pcVar3 = in + __n;
    if (in[__n] == '[') {
      __nptr = pcVar3 + 1;
      pcVar4 = in + __n + 2;
      do {
        if (pcVar4 + -1 == end) {
          *type = ddl_none;
          return end;
        }
        pcVar3 = pcVar4 + 1;
        cVar1 = *pcVar4;
        pcVar4 = pcVar3;
      } while (cVar1 != ']');
      iVar2 = atoi(__nptr);
      *len = (long)iVar2;
    }
    else {
      *len = 1;
    }
  }
  return pcVar3;
}

Assistant:

char *OpenDDLParser::parsePrimitiveDataType( char *in, char *end, Value::ValueType &type, size_t &len ) {
    type = Value::ddl_none;
    len = 0;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    size_t prim_len( 0 );
    for( unsigned int i = 0; i < Value::ddl_types_max; i++ ) {
        prim_len = strlen( Grammar::PrimitiveTypeToken[ i ] );
        if( 0 == strncmp( in, Grammar::PrimitiveTypeToken[ i ], prim_len ) ) {
            type = static_cast<Value::ValueType>( i );
            break;
        }
    }

    if( Value::ddl_none == type ) {
        in = lookForNextToken( in, end );
        return in;
    } else {
        in += prim_len;
    }

    bool ok( true );
    if( *in == Grammar::OpenArrayToken[ 0 ] ) {
        ok = false;
        ++in;
        char *start( in );
        while ( in != end ) {
            ++in;
            if( *in == Grammar::CloseArrayToken[ 0 ] ) {
                len = ::atoi( start );
                ok = true;
                ++in;
                break;
            }
        }
    } else {
        len = 1;
    }
    if( !ok ) {
        type = Value::ddl_none;
    }

    return in;
}